

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int sftp_packet_read(LIBSSH2_SFTP *sftp)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  LIBSSH2_SESSION *pLVar4;
  int iVar5;
  uint32_t uVar6;
  unsigned_long uVar7;
  ssize_t sVar8;
  list_head *plVar9;
  sftp_zombie_requests *psVar10;
  list_node *entry;
  list_node *plVar11;
  size_t sVar12;
  char *pcVar13;
  uint uVar14;
  list_head *plVar15;
  
  channel = sftp->channel;
  session = channel->session;
  if (sftp->packet_state == libssh2_NB_state_sent1) {
    sftp->packet_state = libssh2_NB_state_idle;
    plVar11 = (list_node *)sftp->partial_packet;
LAB_001291c8:
    if (plVar11 == (list_node *)0x0) {
      sVar8 = _libssh2_channel_read
                        (channel,0,(char *)(sftp->packet_header + sftp->packet_header_len),
                         9 - sftp->packet_header_len);
      if (sVar8 == -0x25) {
        return -0x25;
      }
      if (sVar8 < 0) {
        pcVar13 = "channel read";
        iVar5 = (int)sVar8;
        goto LAB_001294bd;
      }
      sVar12 = sftp->packet_header_len + sVar8;
      sftp->packet_header_len = sVar12;
      if (sVar12 != 9) {
        return -0x25;
      }
      uVar6 = _libssh2_ntohu32(sftp->packet_header);
      sftp->partial_len = uVar6;
      uVar2 = sftp->packet_header[4];
      uVar6 = _libssh2_ntohu32(sftp->packet_header + 5);
      uVar3 = sftp->partial_len;
      if ((0x40000 < (ulong)uVar3) &&
         (((sftp->readdir_state == libssh2_NB_state_idle || (sftp->readdir_request_id != uVar6)) ||
          (uVar2 != 'h')))) {
        libssh2_channel_flush_ex(channel,0);
        sftp->packet_header_len = 0;
        pcVar13 = "SFTP packet too large";
        iVar5 = -0x19;
        goto LAB_001294bd;
      }
      if (uVar3 < 5) {
        pcVar13 = "Invalid SFTP packet size";
      }
      else {
        plVar11 = (list_node *)(*session->alloc)((ulong)uVar3,&session->abstract);
        if (plVar11 != (list_node *)0x0) {
          sftp->packet_header_len = 0;
          sftp->partial_packet = (uchar *)plVar11;
          sftp->partial_received = 5;
          *(uchar *)((long)&plVar11->next + 4) = sftp->packet_header[8];
          *(undefined4 *)&plVar11->next = *(undefined4 *)(sftp->packet_header + 4);
          goto LAB_00129173;
        }
        pcVar13 = "Unable to allocate SFTP packet";
      }
      iVar5 = -6;
LAB_001294bd:
      iVar5 = _libssh2_error(session,iVar5,pcVar13);
      return iVar5;
    }
  }
  else {
    if (sftp->packet_state != libssh2_NB_state_sent) {
      plVar11 = (list_node *)0x0;
      goto LAB_001291c8;
    }
    sftp->packet_state = libssh2_NB_state_idle;
    plVar11 = (list_node *)sftp->partial_packet;
LAB_00129173:
    uVar7 = libssh2_channel_window_read_ex(channel,(unsigned_long *)0x0,(unsigned_long *)0x0);
    if (uVar7 < sftp->partial_len) {
      iVar5 = _libssh2_channel_receive_window_adjust
                        (channel,sftp->partial_len * 2,'\x01',(uint *)0x0);
      sftp->packet_state = (uint)(iVar5 == -0x25) * 3;
      if (iVar5 == -0x25) {
        return -0x25;
      }
    }
  }
  plVar9 = (list_head *)sftp->partial_received;
  uVar3 = sftp->partial_len;
  while (plVar15 = (list_head *)(ulong)uVar3, plVar9 < plVar15) {
    sVar8 = _libssh2_channel_read
                      (channel,0,(char *)((long)&plVar9->last + (long)&plVar11->next),
                       (long)plVar15 - (long)plVar9);
    if (sVar8 == -0x25) {
      sftp->packet_state = libssh2_NB_state_sent1;
      return -0x25;
    }
    if (sVar8 < 0) {
      (*session->free)(plVar11,&session->abstract);
      sftp->partial_packet = (uchar *)0x0;
      pcVar13 = "Error waiting for SFTP packet";
      iVar5 = (int)sVar8;
      goto LAB_001294bd;
    }
    plVar9 = (list_head *)(sftp->partial_received + sVar8);
    sftp->partial_received = (size_t)plVar9;
    uVar3 = sftp->partial_len;
  }
  sftp->partial_packet = (uchar *)0x0;
  bVar1 = *(byte *)&plVar11->next;
  uVar14 = 0xffffffd7;
  if (uVar3 < 5) goto LAB_0012941f;
  pLVar4 = sftp->channel->session;
  if (((bVar1 - 1 < 0x14) || (bVar1 - 0x65 < 5)) || (bVar1 - 200 < 2)) {
    uVar6 = _libssh2_ntohu32((uchar *)((long)&plVar11->next + 1));
    if (((*(byte *)&plVar11->next | 2) == 0x67) &&
       (psVar10 = find_zombie_request(sftp,uVar6), psVar10 != (sftp_zombie_requests *)0x0)) {
      (*pLVar4->free)(plVar11,&pLVar4->abstract);
      pLVar4 = sftp->channel->session;
      psVar10 = find_zombie_request(sftp,uVar6);
      uVar14 = 0;
      if (psVar10 != (sftp_zombie_requests *)0x0) {
        _libssh2_list_remove(&psVar10->node);
        (*pLVar4->free)(psVar10,&pLVar4->abstract);
      }
      goto LAB_0012941f;
    }
    entry = (list_node *)(*pLVar4->alloc)(0x30,&pLVar4->abstract);
    if (entry != (list_node *)0x0) {
      entry[1].prev = plVar11;
      entry[1].head = plVar15;
      *(uint32_t *)&entry[1].next = uVar6;
      _libssh2_list_add(&sftp->packets,entry);
      uVar14 = 0;
      goto LAB_0012941f;
    }
    pcVar13 = "Unable to allocate datablock for SFTP packet";
    iVar5 = -6;
  }
  else {
    sftp->last_errno = 0;
    pcVar13 = "Out of sync with the world";
    iVar5 = -0x1f;
  }
  uVar14 = _libssh2_error(pLVar4,iVar5,pcVar13);
LAB_0012941f:
  if (uVar14 == 0) {
    uVar14 = (uint)bVar1;
  }
  else {
    (*session->free)(plVar11,&session->abstract);
  }
  return uVar14;
}

Assistant:

static int
sftp_packet_read(LIBSSH2_SFTP *sftp)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    unsigned char *packet = NULL;
    ssize_t rc;
    unsigned long recv_window;
    int packet_type;
    uint32_t request_id;

    _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "recv packet"));

    switch(sftp->packet_state) {
    case libssh2_NB_state_sent: /* EAGAIN from window adjusting */
        sftp->packet_state = libssh2_NB_state_idle;

        packet = sftp->partial_packet;
        goto window_adjust;

    case libssh2_NB_state_sent1: /* EAGAIN from channel read */
        sftp->packet_state = libssh2_NB_state_idle;

        packet = sftp->partial_packet;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "partial read cont, len: %u", sftp->partial_len));
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "partial read cont, already recvd: %lu",
                       (unsigned long)sftp->partial_received));
        LIBSSH2_FALLTHROUGH();
    default:
        if(!packet) {
            /* only do this if there's not already a packet buffer allocated
               to use */

            /* each packet starts with a 32 bit length field */
            rc = _libssh2_channel_read(channel, 0,
                                       (char *)&sftp->packet_header[
                                           sftp->packet_header_len],
                                       sizeof(sftp->packet_header) -
                                       sftp->packet_header_len);
            if(rc == LIBSSH2_ERROR_EAGAIN)
                return (int)rc;
            else if(rc < 0)
                return _libssh2_error(session, (int)rc, "channel read");

            sftp->packet_header_len += rc;

            if(sftp->packet_header_len != sizeof(sftp->packet_header))
                /* we got a short read for the header part */
                return LIBSSH2_ERROR_EAGAIN;

            /* parse SFTP packet header */
            sftp->partial_len = _libssh2_ntohu32(sftp->packet_header);
            packet_type = sftp->packet_header[4];
            request_id = _libssh2_ntohu32(sftp->packet_header + 5);

            /* make sure we don't proceed if the packet size is unreasonably
               large */
            if(sftp->partial_len > LIBSSH2_SFTP_PACKET_MAXLEN &&
               /* exception: response to SSH_FXP_READDIR request */
               !(sftp->readdir_state != libssh2_NB_state_idle &&
                 sftp->readdir_request_id == request_id &&
                 packet_type == SSH_FXP_NAME)) {
                libssh2_channel_flush(channel);
                sftp->packet_header_len = 0;
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_CHANNEL_PACKET_EXCEEDED,
                                      "SFTP packet too large");
            }

            if(sftp->partial_len < 5)
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_ALLOC,
                                      "Invalid SFTP packet size");

            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "Data begin - Packet Length: %lu",
                           (unsigned long)sftp->partial_len));
            packet = LIBSSH2_ALLOC(session, sftp->partial_len);
            if(!packet)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "Unable to allocate SFTP packet");
            sftp->packet_header_len = 0;
            sftp->partial_packet = packet;
            /* copy over packet type(4) and request id(1) */
            sftp->partial_received = 5;
            memcpy(packet, sftp->packet_header + 4, 5);

window_adjust:
            recv_window = libssh2_channel_window_read_ex(channel, NULL, NULL);

            if(sftp->partial_len > recv_window) {
                /* ask for twice the data amount we need at once */
                rc = _libssh2_channel_receive_window_adjust(channel,
                                                            sftp->partial_len
                                                            * 2,
                                                            1, NULL);
                /* store the state so that we continue with the correct
                   operation at next invoke */
                sftp->packet_state = (rc == LIBSSH2_ERROR_EAGAIN)?
                    libssh2_NB_state_sent:
                    libssh2_NB_state_idle;

                if(rc == LIBSSH2_ERROR_EAGAIN)
                    return (int)rc;
            }
        }

        /* Read as much of the packet as we can */
        while(sftp->partial_len > sftp->partial_received) {
            rc = _libssh2_channel_read(channel, 0,
                                       (char *)&packet[sftp->partial_received],
                                       sftp->partial_len -
                                       sftp->partial_received);

            if(rc == LIBSSH2_ERROR_EAGAIN) {
                /*
                 * We received EAGAIN, save what we have and return EAGAIN to
                 * the caller. Set 'partial_packet' so that this function
                 * knows how to continue on the next invoke.
                 */
                sftp->packet_state = libssh2_NB_state_sent1;
                return (int)rc;
            }
            else if(rc < 0) {
                LIBSSH2_FREE(session, packet);
                sftp->partial_packet = NULL;
                return _libssh2_error(session, (int)rc,
                                      "Error waiting for SFTP packet");
            }
            sftp->partial_received += rc;
        }

        sftp->partial_packet = NULL;

        /* sftp_packet_add takes ownership of the packet and might free it
           so we take a copy of the packet type before we call it. */
        packet_type = packet[0];
        rc = sftp_packet_add(sftp, packet, sftp->partial_len);
        if(rc) {
            LIBSSH2_FREE(session, packet);
            return (int)rc;
        }
        else {
            return packet_type;
        }
    }
    /* WON'T REACH */
}